

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O0

void __thiscall Process::~Process(Process *this)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  bool local_3a;
  int w;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> lock;
  Process *this_local;
  
  lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->mMutex);
  bVar3 = true;
  if (this->mReturn == -2) {
    bVar3 = this->mPid == -1;
  }
  if (!bVar3) {
    __assert_fail("mReturn != ReturnUnset || mPid == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Process.cpp"
                  ,0x10f,"Process::~Process()");
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  local_3a = false;
  if (this->mStdIn[0] != -1) {
    EventLoop::eventLoop();
    local_3a = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&w);
    std::shared_ptr<EventLoop>::~shared_ptr((shared_ptr<EventLoop> *)&w);
  }
  if (local_3a != false) {
    handleInput(this,this->mStdIn[1]);
  }
  closeStdIn(this,CloseForce);
  closeStdOut(this);
  closeStdErr(this);
  if (this->mSync[0] != -1) {
    do {
      iVar1 = close(this->mSync[0]);
      bVar3 = false;
      if (iVar1 == -1) {
        piVar2 = __errno_location();
        bVar3 = *piVar2 == 4;
      }
    } while (bVar3);
  }
  if (this->mSync[1] != -1) {
    do {
      iVar1 = close(this->mSync[1]);
      bVar3 = false;
      if (iVar1 == -1) {
        piVar2 = __errno_location();
        bVar3 = *piVar2 == 4;
      }
    } while (bVar3);
  }
  String::~String(&this->mErrorString);
  Path::~Path(&this->mChRoot);
  Path::~Path(&this->mCwd);
  String::~String(&this->mStdErrBuffer);
  String::~String(&this->mStdOutBuffer);
  std::deque<String,_std::allocator<String>_>::~deque(&this->mStdInBuffer);
  Signal<std::function<void_(Process_*)>_>::~Signal(&this->mFinished);
  Signal<std::function<void_(Process_*)>_>::~Signal(&this->mReadyReadStdErr);
  Signal<std::function<void_(Process_*)>_>::~Signal(&this->mReadyReadStdOut);
  return;
}

Assistant:

Process::~Process()
{
    {
        std::lock_guard<std::mutex> lock(mMutex);
        assert(mReturn != ReturnUnset || mPid == -1);
    }

    if (mStdIn[0] != -1 && EventLoop::eventLoop()) {
        // try to finish off any pending writes
        handleInput(mStdIn[1]);
    }

    closeStdIn(CloseForce);
    closeStdOut();
    closeStdErr();

    int w;
    if (mSync[0] != -1)
        eintrwrap(w, ::close(mSync[0]));
    if (mSync[1] != -1)
        eintrwrap(w, ::close(mSync[1]));
}